

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Project.cpp
# Opt level: O2

void __thiscall Project3D::project(Project3D *this)

{
  SparseMatrix<double,_0,_int> *A;
  Scalar SVar1;
  double dVar2;
  double dVar3;
  uint64_t uVar4;
  unsigned_short uVar5;
  uint uVar6;
  unsigned_long *puVar7;
  Scalar *pSVar8;
  double *pdVar9;
  CellLabel *pCVar10;
  StaggeredGrid<double,_unsigned_short> *pSVar11;
  uint16_t i;
  ushort i_00;
  uint16_t j;
  ushort uVar12;
  uint16_t k;
  ushort uVar13;
  initializer_list<unsigned_short> __l;
  initializer_list<unsigned_short> __l_00;
  initializer_list<unsigned_short> __l_01;
  undefined1 local_80 [8];
  VectorXd x;
  VectorXd b;
  undefined8 local_40;
  uint local_38;
  uint local_34;
  
  x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       ((this->super_Project)._grid)->_activeCells;
  if (x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_80,
               (unsigned_long *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    local_40 = ((this->super_Project)._grid)->_activeCells;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               &local_40);
    A = &(this->super_Project)._A;
    preparePressureSolving
              (this,A,(VectorXd *)
                      &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows);
    ConjugateGradient(A,(VectorXd *)local_80,
                      (VectorXd *)
                      &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows,(this->super_Project)._grid);
    Field<double,_unsigned_short>::reset(&((this->super_Project)._grid)->_pressure);
    uVar13 = 0;
    while( true ) {
      uVar4 = local_40;
      pSVar11 = (this->super_Project)._grid;
      local_40._0_4_ = CONCAT22((pSVar11->_V)._Zsize,(pSVar11->_U)._Zsize);
      local_40._6_2_ = SUB82(uVar4,6);
      local_40._0_6_ = CONCAT24((pSVar11->_W)._Zsize,(undefined4)local_40);
      __l._M_len = 3;
      __l._M_array = (iterator)&local_40;
      uVar5 = std::max<unsigned_short>(__l);
      if (uVar5 <= uVar13) break;
      uVar12 = 0;
      local_34 = (uint)uVar13;
      while( true ) {
        uVar4 = local_40;
        pSVar11 = (this->super_Project)._grid;
        local_40._0_4_ = CONCAT22((pSVar11->_V)._Ysize,(pSVar11->_U)._Ysize);
        local_40._6_2_ = SUB82(uVar4,6);
        local_40._0_6_ = CONCAT24((pSVar11->_W)._Ysize,(undefined4)local_40);
        __l_00._M_len = 3;
        __l_00._M_array = (iterator)&local_40;
        uVar5 = std::max<unsigned_short>(__l_00);
        if (uVar5 <= uVar12) break;
        i_00 = 0;
        local_38 = (uint)uVar12;
        while( true ) {
          uVar4 = local_40;
          pSVar11 = (this->super_Project)._grid;
          local_40._0_4_ = CONCAT22((pSVar11->_V)._Xsize,(pSVar11->_U)._Xsize);
          local_40._6_2_ = SUB82(uVar4,6);
          local_40._0_6_ = CONCAT24((pSVar11->_W)._Xsize,(undefined4)local_40);
          __l_01._M_len = 3;
          __l_01._M_array = (iterator)&local_40;
          uVar5 = std::max<unsigned_short>(__l_01);
          if (uVar5 <= i_00) break;
          pSVar11 = (this->super_Project)._grid;
          if (((uVar13 < (pSVar11->_surface)._Zsize) && (uVar12 < (pSVar11->_surface)._Ysize)) &&
             (i_00 < (pSVar11->_surface)._Xsize)) {
            puVar7 = Field<unsigned_long,_unsigned_short>::operator()
                               (&pSVar11->_pressureID,i_00,(unsigned_short)local_38,
                                (unsigned_short)local_34);
            if (*puVar7 != 0) {
              pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                  local_80,*puVar7 - 1);
              SVar1 = *pSVar8;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&((this->super_Project)._grid)->_pressure,i_00,
                                  (unsigned_short)local_38,(unsigned_short)local_34);
              *pdVar9 = SVar1;
            }
          }
          pSVar11 = (this->super_Project)._grid;
          if (((uVar13 < (pSVar11->_U)._Zsize) && (uVar12 < (pSVar11->_U)._Ysize)) &&
             (i_00 < (pSVar11->_U)._Xsize)) {
            pCVar10 = Field<double,_unsigned_short>::label
                                (&pSVar11->_U,i_00,(unsigned_short)local_38,(unsigned_short)local_34
                                );
            pSVar11 = (this->super_Project)._grid;
            if ((*pCVar10 & LIQUID) != 0) {
              uVar6 = (uint)Config::N;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&pSVar11->_pressure,i_00,(unsigned_short)local_38,
                                  (unsigned_short)local_34);
              dVar2 = *pdVar9;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&((this->super_Project)._grid)->_pressure,i_00 - 1,
                                  (unsigned_short)local_38,(unsigned_short)local_34);
              dVar3 = *pdVar9;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&((this->super_Project)._grid)->_U,i_00,(unsigned_short)local_38,
                                  (unsigned_short)local_34);
              *pdVar9 = *pdVar9 - (dVar2 - dVar3) * (double)uVar6;
              pSVar11 = (this->super_Project)._grid;
            }
          }
          if (((uVar13 < (pSVar11->_V)._Zsize) && (uVar12 < (pSVar11->_V)._Ysize)) &&
             (i_00 < (pSVar11->_V)._Xsize)) {
            pCVar10 = Field<double,_unsigned_short>::label
                                (&pSVar11->_V,i_00,(unsigned_short)local_38,(unsigned_short)local_34
                                );
            pSVar11 = (this->super_Project)._grid;
            if ((*pCVar10 & LIQUID) != 0) {
              uVar6 = (uint)Config::N;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&pSVar11->_pressure,i_00,(unsigned_short)local_38,
                                  (unsigned_short)local_34);
              dVar2 = *pdVar9;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&((this->super_Project)._grid)->_pressure,i_00,uVar12 - 1,
                                  (unsigned_short)local_34);
              dVar3 = *pdVar9;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&((this->super_Project)._grid)->_V,i_00,(unsigned_short)local_38,
                                  (unsigned_short)local_34);
              *pdVar9 = *pdVar9 - (dVar2 - dVar3) * (double)uVar6;
              pSVar11 = (this->super_Project)._grid;
            }
          }
          if (((uVar13 < (pSVar11->_W)._Zsize) && (uVar12 < (pSVar11->_W)._Ysize)) &&
             (i_00 < (pSVar11->_W)._Xsize)) {
            pCVar10 = Field<double,_unsigned_short>::label
                                (&pSVar11->_W,i_00,(unsigned_short)local_38,(unsigned_short)local_34
                                );
            if ((*pCVar10 & LIQUID) != 0) {
              uVar6 = (uint)Config::N;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&((this->super_Project)._grid)->_pressure,i_00,
                                  (unsigned_short)local_38,(unsigned_short)local_34);
              dVar2 = *pdVar9;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&((this->super_Project)._grid)->_pressure,i_00,
                                  (unsigned_short)local_38,uVar13 - 1);
              dVar3 = *pdVar9;
              pdVar9 = Field<double,_unsigned_short>::operator()
                                 (&((this->super_Project)._grid)->_W,i_00,(unsigned_short)local_38,
                                  (unsigned_short)local_34);
              *pdVar9 = *pdVar9 - (dVar2 - dVar3) * (double)uVar6;
            }
          }
          i_00 = i_00 + 1;
        }
        uVar12 = uVar12 + 1;
      }
      uVar13 = uVar13 + 1;
    }
    free((void *)x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    free((void *)local_80);
  }
  return;
}

Assistant:

void Project3D::project()
{
    if (_grid.activeCellsNb() > 0)
    {
        Eigen::VectorXd x(_grid.activeCellsNb());
        Eigen::VectorXd b(_grid.activeCellsNb());

        // Filling A and b matrices/vector
        preparePressureSolving(_A, b);
        // Solving x vector to get pressures
        ConjugateGradient(_A, x, b, _grid);

        _grid._pressure.reset();

        std::uint64_t id;
        // Updates the velocities with pressures
        for (std::uint16_t k = 0;
            k < std::max({_grid._U.z(), _grid._V.z(), _grid._W.z()});
            ++k)
        {
            for (std::uint16_t j = 0;
                j < std::max({_grid._U.y(), _grid._V.y(), _grid._W.y()});
                ++j)
            {
                for (std::uint16_t i = 0;
                    i < std::max({_grid._U.x(), _grid._V.x(), _grid._W.x()});
                    ++i)
                {
                    if (k < _grid._surface.z() && j < _grid._surface.y()
                        && i < _grid._surface.x()
                        && (id = _grid._pressureID(i, j, k)) > 0)
                    {
                        _grid._pressure(i, j, k) = x(id-1);
                    }
                    if (k < _grid._U.z() && j < _grid._U.y()
                        && i < _grid._U.x()
                        && _grid._U.label(i, j, k) & LIQUID)
                    {
                        _grid._U(i, j, k) -=
                            Config::N*(_grid._pressure(i, j, k) -
                                    _grid._pressure(i-1, j, k));
                    }
                    if (k < _grid._V.z() && j < _grid._V.y()
                        && i < _grid._V.x()
                        && _grid._V.label(i, j, k) & LIQUID)
                    {
                        _grid._V(i, j, k) -=
                            Config::N*(_grid._pressure(i, j, k) -
                                    _grid._pressure(i, j-1, k));
                    }
                    if (k < _grid._W.z() && j < _grid._W.y()
                        && i < _grid._W.x()
                        && _grid._W.label(i, j, k) & LIQUID)
                    {
                        _grid._W(i, j, k) -=
                            Config::N*(_grid._pressure(i, j, k) -
                                    _grid._pressure(i, j, k-1));
                    }
                }
            }
        }
    }
}